

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::MinMaxState<unsigned_long>,unsigned_long,duckdb::MinOperation>
               (unsigned_long *idata,AggregateInputData *aggr_input_data,
               MinMaxState<unsigned_long> *state,idx_t count,ValidityMask *mask,
               SelectionVector *sel_vector)

{
  sel_t *psVar1;
  ulong uVar2;
  bool bVar3;
  idx_t i_1;
  idx_t iVar4;
  idx_t i;
  idx_t iVar5;
  
  psVar1 = sel_vector->sel_vector;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar4 = iVar5;
      if (psVar1 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar1[iVar5];
      }
      uVar2 = idata[iVar4];
      if (state->isset == false) {
        state->value = uVar2;
        state->isset = true;
      }
      else if (uVar2 < state->value) {
        state->value = uVar2;
      }
    }
  }
  else {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar4 = iVar5;
      if (psVar1 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar1[iVar5];
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,iVar4);
      if (bVar3) {
        uVar2 = idata[iVar4];
        if (state->isset == false) {
          state->value = uVar2;
          state->isset = true;
        }
        else if (uVar2 < state->value) {
          state->value = uVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}